

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_certificate_chain.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_12::PathVerifier::VerifyPolicyMappings
          (PathVerifier *this,ParsedCertificate *cert,CertErrors *errors)

{
  _Rb_tree_header *p_Var1;
  uchar *puVar2;
  size_t *psVar3;
  byte bVar4;
  pointer pPVar5;
  pointer pmVar6;
  _Base_ptr __y;
  Input *__k;
  size_t sVar7;
  uchar *puVar8;
  Span<const_unsigned_char> lhs;
  Span<const_unsigned_char> policy;
  bool bVar9;
  byte bVar10;
  iterator iVar11;
  vector<bssl::der::Input,std::allocator<bssl::der::Input>> *this_00;
  iterator iVar12;
  ParsedCertificate *pPVar13;
  _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>
  *this_01;
  pointer pPVar14;
  ParsedCertificate *pPVar15;
  ParsedCertificate *pPVar16;
  _Self __tmp;
  iterator __position;
  uchar *puVar17;
  long lVar18;
  ParsedCertificate *pPVar19;
  bool bVar20;
  bool bVar21;
  Input rhs;
  Input rhs_00;
  Input rhs_01;
  Input rhs_02;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> local_78;
  pointer local_58;
  Input local_50;
  key_type local_40;
  
  if (cert->has_policy_mappings_ != true) {
    return;
  }
  pPVar14 = (cert->policy_mappings_).
            super__Vector_base<bssl::ParsedPolicyMapping,_std::allocator<bssl::ParsedPolicyMapping>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pPVar5 = (cert->policy_mappings_).
           super__Vector_base<bssl::ParsedPolicyMapping,_std::allocator<bssl::ParsedPolicyMapping>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar10 = 1;
  __position._M_current = (Input *)cert;
  if (pPVar14 != pPVar5) {
    do {
      rhs.data_.size_ = 4;
      rhs.data_.data_ = "U\x1d ";
      bVar9 = bssl::der::operator==((Input)(pPVar14->issuer_domain_policy).data_,rhs);
      if (bVar9) {
LAB_004b7637:
        ValidPolicyGraph::SetNull(&this->valid_policy_graph_);
        CertErrors::AddError(errors,"PolicyMappings must not map anyPolicy");
        return;
      }
      __position._M_current = (Input *)(pPVar14->subject_domain_policy).data_.size_;
      rhs_00.data_.size_ = 4;
      rhs_00.data_.data_ = "U\x1d ";
      bVar9 = bssl::der::operator==((Input)(pPVar14->subject_domain_policy).data_,rhs_00);
      if (bVar9) goto LAB_004b7637;
      pPVar14 = pPVar14 + 1;
    } while (pPVar14 != pPVar5);
    bVar10 = cert->has_policy_mappings_;
  }
  if (this->policy_mapping_ != 0) {
    if ((bVar10 & 1) == 0) goto LAB_004b769f;
    pPVar14 = (cert->policy_mappings_).
              super__Vector_base<bssl::ParsedPolicyMapping,_std::allocator<bssl::ParsedPolicyMapping>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pPVar5 = (cert->policy_mappings_).
             super__Vector_base<bssl::ParsedPolicyMapping,_std::allocator<bssl::ParsedPolicyMapping>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pPVar14 == pPVar5) {
      return;
    }
    do {
      pPVar13 = (ParsedCertificate *)(pPVar14->issuer_domain_policy).data_.data_;
      local_50.data_.size_ = (pPVar14->issuer_domain_policy).data_.size_;
      policy = (pPVar14->issuer_domain_policy).data_;
      local_40.data_.data_ = (pPVar14->subject_domain_policy).data_.data_;
      __position._M_current = (Input *)(pPVar14->subject_domain_policy).data_.size_;
      lhs = (pPVar14->subject_domain_policy).data_;
      rhs_01.data_.size_ = 4;
      rhs_01.data_.data_ = "U\x1d ";
      local_50.data_.data_ = (uchar *)pPVar13;
      local_40.data_.size_ = (size_t)__position._M_current;
      bVar9 = bssl::der::operator!=((Input)(pPVar14->issuer_domain_policy).data_,rhs_01);
      if (!bVar9) {
        __assert_fail("issuer_policy != der::Input(kAnyPolicyOid)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_certificate_chain.cc"
                      ,0x2a2,
                      "void bssl::(anonymous namespace)::ValidPolicyGraph::AddPolicyMapping(der::Input, der::Input)"
                     );
      }
      rhs_02.data_.size_ = 4;
      rhs_02.data_.data_ = "U\x1d ";
      bVar9 = bssl::der::operator!=((Input)lhs,rhs_02);
      if (!bVar9) {
        __assert_fail("subject_policy != der::Input(kAnyPolicyOid)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_certificate_chain.cc"
                      ,0x2a3,
                      "void bssl::(anonymous namespace)::ValidPolicyGraph::AddPolicyMapping(der::Input, der::Input)"
                     );
      }
      pmVar6 = (this->valid_policy_graph_).levels_.
               super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((this->valid_policy_graph_).levels_.
          super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != pmVar6) {
        iVar11 = ::std::
                 map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>
                 ::find(pmVar6 + -1,(key_type *)pPVar13);
        if ((_Rb_tree_header *)iVar11._M_node == &pmVar6[-1]._M_t._M_impl.super__Rb_tree_header) {
          __position._M_current = (Input *)pPVar13;
          if ((this->valid_policy_graph_).current_level_.has_any_policy != true) goto LAB_004b73b4;
          local_78.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_78.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_78.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          iVar11 = ValidPolicyGraph::AddNodeReturningIterator
                             (&this->valid_policy_graph_,(Input)policy,&local_78);
          if (local_78.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_78.
                            super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_78.
                                  super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_78.
                                  super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
        }
        *(undefined1 *)&iVar11._M_node[2]._M_parent = 1;
        this_00 = (vector<bssl::der::Input,std::allocator<bssl::der::Input>> *)
                  ::std::
                  map<bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>_>
                  ::operator[](&(this->valid_policy_graph_).current_level_.expected_policy_map,
                               &local_40);
        __position._M_current = *(Input **)(this_00 + 8);
        if (__position._M_current == *(Input **)(this_00 + 0x10)) {
          ::std::vector<bssl::der::Input,std::allocator<bssl::der::Input>>::
          _M_realloc_insert<bssl::der::Input_const&>(this_00,__position,&local_50);
        }
        else {
          ((__position._M_current)->data_).data_ = local_50.data_.data_;
          ((__position._M_current)->data_).size_ = local_50.data_.size_;
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x10;
        }
      }
LAB_004b73b4:
      pPVar14 = pPVar14 + 1;
    } while (pPVar14 != pPVar5);
    if (this->policy_mapping_ != 0) {
      return;
    }
    bVar10 = cert->has_policy_mappings_;
  }
  if ((bVar10 & 1) != 0) {
    pPVar14 = (cert->policy_mappings_).
              super__Vector_base<bssl::ParsedPolicyMapping,_std::allocator<bssl::ParsedPolicyMapping>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_58 = (cert->policy_mappings_).
               super__Vector_base<bssl::ParsedPolicyMapping,_std::allocator<bssl::ParsedPolicyMapping>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (pPVar14 != local_58) {
      do {
        pmVar6 = (this->valid_policy_graph_).levels_.
                 super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((this->valid_policy_graph_).levels_.
            super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != pmVar6) {
          p_Var1 = &pmVar6[-1]._M_t._M_impl.super__Rb_tree_header;
          pPVar13 = (ParsedCertificate *)
                    pmVar6[-1]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          pPVar15 = (ParsedCertificate *)p_Var1;
          iVar12._M_node = &p_Var1->_M_header;
          if (pPVar13 != (ParsedCertificate *)0x0) {
            __y = (_Base_ptr)(pPVar14->issuer_domain_policy).data_.data_;
            __k = (Input *)(pPVar14->issuer_domain_policy).data_.size_;
            puVar2 = (uchar *)((long)&__k[-1].data_.size_ + 7);
            __position._M_current = (Input *)pPVar13;
            do {
              sVar7 = (((ParsedCertificate *)__position._M_current)->tbs_certificate_tlv_).data_.
                      size_;
              puVar8 = (((ParsedCertificate *)__position._M_current)->signature_algorithm_tlv_).
                       data_.data_;
              bVar20 = puVar8 != (uchar *)0x0;
              bVar9 = __k != (Input *)0x0;
              if ((bVar20) && (__k != (Input *)0x0)) {
                puVar17 = (uchar *)0x0;
                do {
                  bVar10 = puVar17[sVar7];
                  bVar4 = puVar17[(long)&__y->_M_color];
                  if (bVar10 < bVar4) goto LAB_004b74ff;
                  if (bVar10 >= bVar4 && bVar10 != bVar4) goto LAB_004b74b2;
                  bVar9 = puVar2 != puVar17;
                } while ((puVar8 + -1 != puVar17) &&
                        (bVar21 = puVar2 != puVar17, puVar17 = puVar17 + 1, bVar21));
              }
              if (!bVar9) {
LAB_004b74b2:
                pPVar19 = (ParsedCertificate *)__position._M_current;
                if ((__k != (Input *)0x0) && (puVar8 != (uchar *)0x0)) {
                  puVar17 = (uchar *)0x0;
                  do {
                    bVar10 = puVar17[(long)&__y->_M_color];
                    bVar4 = puVar17[sVar7];
                    if (bVar10 < bVar4) {
                      lVar18 = 0x10;
                      goto LAB_004b7502;
                    }
                    if (bVar10 >= bVar4 && bVar10 != bVar4) goto LAB_004b7522;
                    bVar20 = puVar8 + -1 != puVar17;
                  } while ((puVar2 != puVar17) &&
                          (bVar9 = puVar8 + -1 != puVar17, puVar17 = puVar17 + 1, bVar9));
                }
                lVar18 = 0x10;
                if (bVar20) goto LAB_004b7502;
LAB_004b7522:
                pPVar19 = (ParsedCertificate *)
                          (((ParsedCertificate *)__position._M_current)->tbs_certificate_tlv_).data_
                          .data_;
                iVar12 = ::std::
                         _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>
                         ::_M_lower_bound((_Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>
                                           *)(((ParsedCertificate *)__position._M_current)->cert_).
                                             data_.size_,(_Link_type)__position._M_current,__y,__k);
                for (; pPVar19 != (ParsedCertificate *)0x0;
                    pPVar19 = *(ParsedCertificate **)
                               ((long)&(pPVar19->cert_data_)._M_t.
                                       super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                       .super__Head_base<0UL,_crypto_buffer_st_*,_false>.
                                       _M_head_impl + lVar18)) {
                  puVar8 = (pPVar19->signature_algorithm_tlv_).data_.data_;
                  bVar9 = puVar8 != (uchar *)0x0;
                  pPVar16 = pPVar19;
                  if ((__k != (Input *)0x0) && (puVar8 != (uchar *)0x0)) {
                    __position._M_current = (Input *)(pPVar19->tbs_certificate_tlv_).data_.size_;
                    puVar17 = (uchar *)0x0;
                    do {
                      bVar10 = puVar17[(long)&__y->_M_color];
                      bVar4 = puVar17[(long)&((ParsedCertificate *)__position._M_current)->
                                             cert_data_];
                      if (bVar10 < bVar4) {
                        lVar18 = 0x10;
                        goto LAB_004b75a6;
                      }
                      if (bVar10 >= bVar4 && bVar10 != bVar4) goto LAB_004b7594;
                      bVar9 = puVar8 + -1 != puVar17;
                    } while ((puVar2 != puVar17) &&
                            (bVar20 = puVar8 + -1 != puVar17, puVar17 = puVar17 + 1, bVar20));
                  }
                  lVar18 = 0x10;
                  if (!bVar9) {
LAB_004b7594:
                    lVar18 = 0x18;
                    pPVar16 = pPVar15;
                  }
LAB_004b75a6:
                  pPVar15 = pPVar16;
                }
                break;
              }
LAB_004b74ff:
              lVar18 = 0x18;
              pPVar19 = pPVar15;
LAB_004b7502:
              pPVar15 = pPVar19;
              __position._M_current =
                   *(Input **)
                    ((long)&(((ParsedCertificate *)__position._M_current)->cert_data_)._M_t.
                            super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl + lVar18);
              iVar12._M_node = (_Base_ptr)pPVar15;
            } while ((ParsedCertificate *)__position._M_current != (ParsedCertificate *)0x0);
          }
          if (((ParsedCertificate *)pmVar6[-1]._M_t._M_impl.super__Rb_tree_header._M_header._M_left
               == (ParsedCertificate *)iVar12._M_node) && ((ParsedCertificate *)p_Var1 == pPVar15))
          {
            ::std::
            _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>
            ::_M_erase((_Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>
                        *)pPVar13,(_Link_type)__position._M_current);
            pmVar6[-1]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            pmVar6[-1]._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
            pmVar6[-1]._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
            pmVar6[-1]._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          }
          else {
            while ((ParsedCertificate *)iVar12._M_node != pPVar15) {
              pPVar13 = (ParsedCertificate *)::std::_Rb_tree_increment(iVar12._M_node);
              __position._M_current = (Input *)p_Var1;
              this_01 = (_Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>
                         *)::std::_Rb_tree_rebalance_for_erase(iVar12._M_node,&p_Var1->_M_header);
              ::std::
              _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>
              ::_M_drop_node(this_01,(_Link_type)__position._M_current);
              psVar3 = &pmVar6[-1]._M_t._M_impl.super__Rb_tree_header._M_node_count;
              *psVar3 = *psVar3 - 1;
              iVar12._M_node = (_Base_ptr)pPVar13;
            }
          }
        }
        pPVar14 = pPVar14 + 1;
      } while (pPVar14 != local_58);
    }
    return;
  }
LAB_004b769f:
  abort();
}

Assistant:

void PathVerifier::VerifyPolicyMappings(const ParsedCertificate &cert,
                                        CertErrors *errors) {
  if (!cert.has_policy_mappings()) {
    return;
  }

  // From RFC 5280 section 6.1.4:
  //
  //  (a)  If a policy mappings extension is present, verify that the
  //       special value anyPolicy does not appear as an
  //       issuerDomainPolicy or a subjectDomainPolicy.
  for (const ParsedPolicyMapping &mapping : cert.policy_mappings()) {
    if (mapping.issuer_domain_policy == der::Input(kAnyPolicyOid) ||
        mapping.subject_domain_policy == der::Input(kAnyPolicyOid)) {
      // Because this implementation continues processing certificates after
      // this error, clear the valid policy graph to ensure the
      // "user_constrained_policy_set" output upon failure is empty.
      valid_policy_graph_.SetNull();
      errors->AddError(cert_errors::kPolicyMappingAnyPolicy);
      return;
    }
  }

  //  (b)  If a policy mappings extension is present, then for each
  //       issuerDomainPolicy ID-P in the policy mappings extension:
  //
  //     (1)  If the policy_mapping variable is greater than 0, for each
  //          node in the valid_policy_tree of depth i where ID-P is the
  //          valid_policy, set expected_policy_set to the set of
  //          subjectDomainPolicy values that are specified as
  //          equivalent to ID-P by the policy mappings extension.
  //
  //          If no node of depth i in the valid_policy_tree has a
  //          valid_policy of ID-P but there is a node of depth i with a
  //          valid_policy of anyPolicy, then generate a child node of
  //          the node of depth i-1 that has a valid_policy of anyPolicy
  //          as follows:
  //
  //        (i)    set the valid_policy to ID-P;
  //
  //        (ii)   set the qualifier_set to the qualifier set of the
  //               policy anyPolicy in the certificate policies
  //               extension of certificate i; and
  //
  //        (iii)  set the expected_policy_set to the set of
  //               subjectDomainPolicy values that are specified as
  //               equivalent to ID-P by the policy mappings extension.
  //
  if (policy_mapping_ > 0) {
    for (const ParsedPolicyMapping &mapping : cert.policy_mappings()) {
      valid_policy_graph_.AddPolicyMapping(mapping.issuer_domain_policy,
                                           mapping.subject_domain_policy);
    }
  }

  //  (b)  If a policy mappings extension is present, then for each
  //       issuerDomainPolicy ID-P in the policy mappings extension:
  //
  //  ...
  //
  //     (2)  If the policy_mapping variable is equal to 0:
  //
  //        (i)    delete each node of depth i in the valid_policy_tree
  //               where ID-P is the valid_policy.
  //
  //        (ii)   If there is a node in the valid_policy_tree of depth
  //               i-1 or less without any child nodes, delete that
  //               node.  Repeat this step until there are no nodes of
  //               depth i-1 or less without children.
  //
  // Step (ii) is deferred to part of GetUserConstrainedPolicySet().
  if (policy_mapping_ == 0) {
    for (const ParsedPolicyMapping &mapping : cert.policy_mappings()) {
      valid_policy_graph_.DeleteNode(mapping.issuer_domain_policy);
    }
  }
}